

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O0

size_t __thiscall Creature::mutate(Creature *this,double prob)

{
  bool bVar1;
  reference this_00;
  type this_01;
  size_t sVar2;
  double dVar3;
  __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
  local_30;
  __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
  local_28;
  iterator it;
  size_t flipctr;
  double prob_local;
  Creature *this_local;
  
  it._M_current = (shared_ptr<Chromosome> *)0x0;
  local_28._M_current =
       (shared_ptr<Chromosome> *)
       std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>::
       begin(&this->chroms);
  while( true ) {
    local_30._M_current =
         (shared_ptr<Chromosome> *)
         std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
         ::end(&this->chroms);
    bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
              ::operator*(&local_28);
    this_01 = boost::shared_ptr<Chromosome>::operator->(this_00);
    sVar2 = Chromosome::mutate(this_01,prob);
    it._M_current = (shared_ptr<Chromosome> *)((long)&(it._M_current)->px + sVar2);
    __gnu_cxx::
    __normal_iterator<boost::shared_ptr<Chromosome>_*,_std::vector<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>_>
    ::operator++(&local_28);
  }
  if (it._M_current != (shared_ptr<Chromosome> *)0x0) {
    dVar3 = make_fitness(this);
    this->fitness = dVar3;
  }
  return (size_t)it._M_current;
}

Assistant:

size_t Creature::mutate( double prob )
{
	size_t flipctr = 0;

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		flipctr += (*it)->mutate(prob);
	}

	if(flipctr)
		fitness = make_fitness();

	return flipctr;
}